

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O2

void __thiscall Assimp::ExporterPimpl::~ExporterPimpl(ExporterPimpl *this)

{
  aiExportDataBlob *this_00;
  pointer ppBVar1;
  BaseProcess *pBVar2;
  uint uVar3;
  
  this_00 = this->blob;
  if (this_00 != (aiExportDataBlob *)0x0) {
    aiExportDataBlob::~aiExportDataBlob(this_00);
  }
  operator_delete(this_00,0x420);
  uVar3 = 0;
  while( true ) {
    ppBVar1 = (this->mPostProcessingSteps).
              super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mPostProcessingSteps).
                      super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <=
        (ulong)uVar3) break;
    pBVar2 = ppBVar1[uVar3];
    if (pBVar2 != (BaseProcess *)0x0) {
      (*pBVar2->_vptr_BaseProcess[1])();
    }
    uVar3 = uVar3 + 1;
  }
  if (this->mProgressHandler != (ProgressHandler *)0x0) {
    (*this->mProgressHandler->_vptr_ProgressHandler[1])();
  }
  std::
  _Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::~_Vector_base(&(this->mExporters).
                   super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
                 );
  std::__cxx11::string::~string((string *)&this->mError);
  std::_Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::~_Vector_base
            (&(this->mPostProcessingSteps).
              super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~ExporterPimpl() {
        delete blob;

        // Delete all post-processing plug-ins
        for( unsigned int a = 0; a < mPostProcessingSteps.size(); a++) {
            delete mPostProcessingSteps[a];
        }
        delete mProgressHandler;
    }